

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

void __thiscall StaticTaintAnalysisPass::initTaintSource(StaticTaintAnalysisPass *this,Module *M)

{
  bool bVar1;
  pointer pFVar2;
  pointer pBVar3;
  reference local_58;
  reference local_50;
  Instruction *pi;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
  local_40;
  iterator pI;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
  local_30;
  iterator pB;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  local_20;
  iterator pF;
  Module *M_local;
  StaticTaintAnalysisPass *this_local;
  
  pF.NodePtr = (node_pointer)M;
  local_20.NodePtr = (node_pointer)llvm::Module::begin(M);
  while( true ) {
    pB.NodePtr = (node_pointer)llvm::Module::end((Module *)pF.NodePtr);
    bVar1 = llvm::operator!=(&local_20,
                             (ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                              *)&pB);
    if (!bVar1) break;
    pFVar2 = llvm::
             ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
             ::operator->(&local_20);
    local_30.NodePtr = (node_pointer)llvm::Function::begin(pFVar2);
    while( true ) {
      pFVar2 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
               ::operator->(&local_20);
      pI.NodePtr = (node_pointer)llvm::Function::end(pFVar2);
      bVar1 = llvm::operator!=(&local_30,
                               (ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                                *)&pI);
      if (!bVar1) break;
      pBVar3 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
               ::operator->(&local_30);
      local_40.NodePtr = (node_pointer)llvm::BasicBlock::begin(pBVar3);
      while( true ) {
        pBVar3 = llvm::
                 ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                 ::operator->(&local_30);
        pi = (Instruction *)llvm::BasicBlock::end(pBVar3);
        bVar1 = llvm::operator!=(&local_40,
                                 (ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                                  *)&pi);
        if (!bVar1) break;
        local_50 = llvm::
                   ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                   ::operator*(&local_40);
        bVar1 = isTaintSource(this,local_50);
        if (bVar1) {
          local_58 = local_50;
          std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::push_back
                    (&this->taintSource,(value_type *)&local_58);
        }
        llvm::
        ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
        ::operator++(&local_40);
      }
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
      ::operator++(&local_30);
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void
StaticTaintAnalysisPass::initTaintSource(Module& M) {
    for ( auto pF = M.begin(); pF != M.end() ; ++ pF )  {
        for ( auto pB = pF->begin(); pB != pF->end(); ++pB ) {
            for ( auto pI = pB->begin(); pI != pB->end(); ++pI) {
                Instruction *pi = &(*pI) ;
                if ( isTaintSource(pi) ) {
                    taintSource.push_back(pi);
                }
            }       
        }
    }
}